

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pu.cpp
# Opt level: O3

void __thiscall PU_failures_Test::TestBody(PU_failures_Test *this)

{
  char *in_R9;
  double dVar1;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string local_30;
  
  dVar1 = units::convert<units::precise_unit,units::unit>
                    (0.76,(precise_unit *)units::precise::special::mach,(unit *)&units::puMW);
  local_40[0] = (internal)NAN(dVar1);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,
               (AssertionResult *)"std::isnan(convert(0.76, precise::special::mach, puMW))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x70,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  dVar1 = units::convert<units::unit,units::unit>(0.262,(unit *)&units::puV,(unit *)&units::puMW);
  local_40[0] = (internal)NAN(dVar1);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"std::isnan(convert(0.262, puV, puMW))","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x71,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  dVar1 = units::convert<units::unit,units::unit>(1.3,(unit *)&units::puV,(unit *)&units::ft);
  local_40[0] = (internal)NAN(dVar1);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"std::isnan(convert(1.3, puV, ft))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x72,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  dVar1 = units::convert<units::unit,units::unit>
                    (1.0,(unit *)&units::puV,(unit *)&units::ft,10000.0);
  local_40[0] = (internal)NAN(dVar1);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_40[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,local_40,(AssertionResult *)"std::isnan(convert(1.0, puV, ft, 10000))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_pu.cpp",
               0x73,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

TEST(PU, failures)
{
    EXPECT_TRUE(std::isnan(convert(0.76, precise::special::mach, puMW)));
    EXPECT_TRUE(std::isnan(convert(0.262, puV, puMW)));
    EXPECT_TRUE(std::isnan(convert(1.3, puV, ft)));
    EXPECT_TRUE(std::isnan(convert(1.0, puV, ft, 10000)));
}